

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_sysconfig_files.c
# Opt level: O2

ares_status_t
ares_sysconfig_parse_resolv_line
          (ares_channel_t *channel,ares_sysconfig_t *sysconfig,ares_buf_t *line)

{
  ares_bool_t aVar1;
  ares_status_t aVar2;
  ares_status_t aVar3;
  size_t sVar4;
  char option [32];
  char value [512];
  
  aVar1 = ares_buf_begins_with(line,"#",1);
  aVar2 = ARES_SUCCESS;
  aVar3 = ARES_SUCCESS;
  if ((aVar1 == ARES_FALSE) &&
     (aVar1 = ares_buf_begins_with(line,";",1), aVar3 = aVar2, aVar1 == ARES_FALSE)) {
    ares_buf_tag(line);
    sVar4 = ares_buf_consume_nonwhitespace(line);
    if ((sVar4 != 0) && (aVar2 = ares_buf_tag_fetch_string(line,option,0x20), aVar2 == ARES_SUCCESS)
       ) {
      ares_buf_consume_whitespace(line,ARES_TRUE);
      aVar2 = buf_fetch_string(line,value,0x200);
      if ((aVar2 == ARES_SUCCESS) && (ares_str_trim(value), value[0] != '\0')) {
        aVar1 = ares_streq(option,"domain");
        if (aVar1 == ARES_FALSE) {
          aVar1 = ares_streq(option,"lookup");
          if ((aVar1 != ARES_FALSE) ||
             (aVar1 = ares_streq(option,"hostresorder"), aVar1 != ARES_FALSE)) {
            ares_buf_tag_rollback(line);
            aVar3 = config_lookup(sysconfig,line," \t");
            return aVar3;
          }
          aVar1 = ares_streq(option,"search");
          if (aVar1 == ARES_FALSE) {
            aVar1 = ares_streq(option,"nameserver");
            if (aVar1 != ARES_FALSE) {
              aVar3 = ares_sconfig_append_fromstr(channel,&sysconfig->sconfig,value,ARES_TRUE);
              return aVar3;
            }
            aVar1 = ares_streq(option,"sortlist");
            if (aVar1 == ARES_FALSE) {
              aVar1 = ares_streq(option,"options");
              if (aVar1 == ARES_FALSE) {
                return ARES_SUCCESS;
              }
              aVar3 = ares_sysconfig_set_options(sysconfig,value);
              return aVar3;
            }
            aVar3 = ares_parse_sortlist(&sysconfig->sortlist,&sysconfig->nsortlist,value);
            if (aVar3 != ARES_ENOMEM) {
              return ARES_SUCCESS;
            }
            return ARES_ENOMEM;
          }
          sVar4 = 0;
        }
        else {
          if (sysconfig->domains != (char **)0x0) {
            return ARES_SUCCESS;
          }
          sVar4 = 1;
        }
        aVar3 = config_search(sysconfig,value,sVar4);
      }
    }
  }
  return aVar3;
}

Assistant:

ares_status_t ares_sysconfig_parse_resolv_line(const ares_channel_t *channel,
                                               ares_sysconfig_t     *sysconfig,
                                               ares_buf_t           *line)
{
  char          option[32];
  char          value[512];
  ares_status_t status = ARES_SUCCESS;

  /* Ignore lines beginning with a comment */
  if (ares_buf_begins_with(line, (const unsigned char *)"#", 1) ||
      ares_buf_begins_with(line, (const unsigned char *)";", 1)) {
    return ARES_SUCCESS;
  }

  ares_buf_tag(line);

  /* Shouldn't be possible, but if it happens, ignore the line. */
  if (ares_buf_consume_nonwhitespace(line) == 0) {
    return ARES_SUCCESS;
  }

  status = ares_buf_tag_fetch_string(line, option, sizeof(option));
  if (status != ARES_SUCCESS) {
    return ARES_SUCCESS;
  }

  ares_buf_consume_whitespace(line, ARES_TRUE);

  status = buf_fetch_string(line, value, sizeof(value));
  if (status != ARES_SUCCESS) {
    return ARES_SUCCESS;
  }

  ares_str_trim(value);
  if (*value == 0) {
    return ARES_SUCCESS;
  }

  /* At this point we have a string option and a string value, both trimmed
   * of leading and trailing whitespace.  Lets try to evaluate them */
  if (ares_streq(option, "domain")) {
    /* Domain is legacy, don't overwrite an existing config set by search */
    if (sysconfig->domains == NULL) {
      status = config_search(sysconfig, value, 1);
    }
  } else if (ares_streq(option, "lookup") ||
             ares_streq(option, "hostresorder")) {
    ares_buf_tag_rollback(line);
    status = config_lookup(sysconfig, line, " \t");
  } else if (ares_streq(option, "search")) {
    status = config_search(sysconfig, value, 0);
  } else if (ares_streq(option, "nameserver")) {
    status = ares_sconfig_append_fromstr(channel, &sysconfig->sconfig, value,
                                         ARES_TRUE);
  } else if (ares_streq(option, "sortlist")) {
    /* Ignore all failures except ENOMEM.  If the sysadmin set a bad
     * sortlist, just ignore the sortlist, don't cause an inoperable
     * channel */
    status =
      ares_parse_sortlist(&sysconfig->sortlist, &sysconfig->nsortlist, value);
    if (status != ARES_ENOMEM) {
      status = ARES_SUCCESS;
    }
  } else if (ares_streq(option, "options")) {
    status = ares_sysconfig_set_options(sysconfig, value);
  }

  return status;
}